

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string32_suite::test_one(void)

{
  decoder *decoder_00;
  value_type input [6];
  decoder decoder;
  undefined4 local_7c;
  uchar local_78 [8];
  return_type local_70;
  decoder local_50;
  
  local_78[4] = '\0';
  local_78[5] = 'A';
  local_78[0] = 0xc9;
  local_78[1] = '\x01';
  local_78[2] = '\0';
  local_78[3] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[6]>
            (&local_50,(uchar (*) [6])local_78);
  local_70._M_dataplus._M_p._0_4_ = local_50.current.code;
  local_7c = 0xc9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49b,"void string32_suite::test_one()",&local_70,&local_7c);
  trial::protocol::bintoken::detail::decoder::overloader<trial::protocol::bintoken::token::string>::
  decode_abi_cxx11_(&local_70,(overloader<trial::protocol::bintoken::token::string> *)&local_50,
                    decoder_00);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.value<token::string>()","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49c,"void string32_suite::test_one()",&local_70,"A");
  std::__cxx11::string::~string((string *)&local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_70._M_dataplus._M_p._0_4_ = local_50.current.code;
  local_7c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49e,"void string32_suite::test_one()",&local_70,&local_7c);
  return;
}

Assistant:

void test_one()
{
    const value_type input[] = { token::code::string32, 0x01, 0x00, 0x00, 0x00, 0x41 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "A");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}